

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

int ghc::filesystem::rename(char *__old,char *__new)

{
  uint code;
  int iVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  uint local_58 [2];
  error_category *local_50;
  string local_48;
  
  local_58[0] = 0;
  local_50 = (error_category *)std::_V2::system_category();
  iVar1 = rename((filesystem *)__old,__new,(char *)local_58);
  code = local_58[0];
  if (local_58[0] == 0) {
    return iVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_50;
  filesystem_error::filesystem_error(this,&local_48,(path *)__old,(path *)__new,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void rename(const path& from, const path& to)
{
    std::error_code ec;
    rename(from, to, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
}